

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeCursor(Btree *p,Pgno iTable,int wrFlag,KeyInfo *pKeyInfo,BtCursor *pCur)

{
  int *piVar1;
  int iVar2;
  
  if (p->sharable != '\0') {
    p->wantToLock = p->wantToLock + 1;
    if (p->locked == '\0') {
      btreeLockCarefully(p);
    }
    iVar2 = btreeCursor(p,iTable,wrFlag,pKeyInfo,pCur);
    if (p->sharable != '\0') {
      piVar1 = &p->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        unlockBtreeMutex(p);
      }
    }
    return iVar2;
  }
  iVar2 = btreeCursor(p,iTable,wrFlag,pKeyInfo,pCur);
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCursor(
  Btree *p,                                   /* The btree */
  Pgno iTable,                                /* Root page of table to open */
  int wrFlag,                                 /* 1 to write. 0 read-only */
  struct KeyInfo *pKeyInfo,                   /* First arg to xCompare() */
  BtCursor *pCur                              /* Write new cursor here */
){
  if( p->sharable ){
    return btreeCursorWithLock(p, iTable, wrFlag, pKeyInfo, pCur);
  }else{
    return btreeCursor(p, iTable, wrFlag, pKeyInfo, pCur);
  }
}